

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfx2wav.cc
# Opt level: O2

PBuffer __thiscall ConvertorSFX2WAV::create_data(ConvertorSFX2WAV *this,PBuffer *data)

{
  byte bVar1;
  byte *pbVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  short sVar5;
  short sVar6;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PBuffer PVar7;
  PMutableBuffer res;
  
  std::make_shared<MutableBuffer,Buffer::EndianessMode>((EndianessMode *)&res);
  while( true ) {
    bVar4 = Buffer::readable((Buffer *)*in_RDX);
    _Var3 = res.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (!bVar4) break;
    pbVar2 = *(byte **)(*in_RDX + 0x40);
    bVar1 = *pbVar2;
    *(byte **)(*in_RDX + 0x40) = pbVar2 + 1;
    sVar6 = (ushort)bVar1 +
            (short)*(undefined4 *)
                    &data[3].super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
    sVar5 = 0xff - sVar6;
    if (*(char *)((long)&data[3].super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 4) == '\0') {
      sVar5 = sVar6;
    }
    MutableBuffer::push<short>
              (res.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,sVar5 * 0xff
               ,1);
  }
  res.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ConvertorPCM2WAV).super_Convertor._vptr_Convertor =
       (_func_int **)res.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_ConvertorPCM2WAV).super_Convertor.buffer.
  super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var3._M_pi;
  res.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&res.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar7.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar7.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar7.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorSFX2WAV::create_data(PBuffer data) {
  PMutableBuffer res = std::make_shared<MutableBuffer>(Buffer::EndianessBig);

  while (data->readable()) {
    int value = data->pop<uint8_t>();
    value = value + level;
    if (invert) {
      value = 0xFF - value;
    }
    value *= 0xFF;
    res->push<int16_t>(value);
  }

  return res;
}